

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O2

void io::uci::parseGo(string *input,SearchInfo *info,Board *pos)

{
  bool bVar1;
  int increment;
  istream *piVar2;
  int64_t iVar3;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  string val;
  string key;
  istringstream ss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)input,_S_in);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  increment = 0;
  val.field_2._M_local_buf[0] = '\0';
  local_210 = 0xffffffff;
  local_20c = local_210;
  local_208 = local_210;
  local_204 = local_210;
  while (piVar2 = std::operator>>((istream *)&ss,(string *)&key),
        ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    bVar1 = std::operator==(&key,"depth");
    if (bVar1) {
      std::operator>>((istream *)&ss,(string *)&val);
      local_208 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
    }
    else {
      bVar1 = std::operator==(&key,"wtime");
      if (((bVar1) && (pos->side == 0)) ||
         ((bVar1 = std::operator==(&key,"btime"), bVar1 && (pos->side == 1)))) {
        std::operator>>((istream *)&ss,(string *)&val);
        local_204 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
      }
      else {
        bVar1 = std::operator==(&key,"winc");
        if (((bVar1) && (pos->side == 0)) ||
           ((bVar1 = std::operator==(&key,"binc"), bVar1 && (pos->side == 1)))) {
          std::operator>>((istream *)&ss,(string *)&val);
          increment = std::__cxx11::stoi(&val,(size_t *)0x0,10);
        }
        else {
          bVar1 = std::operator==(&key,"movetime");
          if (bVar1) {
            std::operator>>((istream *)&ss,(string *)&val);
            local_20c = std::__cxx11::stoi(&val,(size_t *)0x0,10);
          }
          else {
            bVar1 = std::operator==(&key,"movestogo");
            if (bVar1) {
              std::operator>>((istream *)&ss,(string *)&val);
              local_210 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
            }
          }
        }
      }
    }
  }
  iVar3 = utils::getTime();
  info->startTime = iVar3;
  info->depth = local_208;
  if (-1 < (int)local_20c) {
    local_210 = 1;
    local_204 = local_20c;
  }
  if (0 < (int)local_210 && -1 < (int)local_204) {
    local_204 = local_204 / local_210;
  }
  search::SearchInfo::calculateStopTime(info,local_204,increment);
  search::go();
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return;
}

Assistant:

void io::uci::parseGo(const std::string& input, search::SearchInfo& info, board::Board& pos)
{
    int inc = 0;
    int depth = -1;
    int time = -1;
    int movetime = -1;
    int movestogo = -1;
    std::istringstream ss(input);
    std::string key;
    std::string val;
    while (ss >> key) {
        if (key == "depth") {
            ss >> val;
            depth = stoi(val);
        }
        else if (key == "wtime" && pos.getSide() == board::WHITE) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "btime" && pos.getSide() == board::BLACK) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "winc" && pos.getSide() == board::WHITE) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "binc" && pos.getSide() == board::BLACK) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "movetime") {
            ss >> val;
            movetime = stoi(val);
        }
        else if (key == "movestogo") {
            ss >> val;
            movestogo = stoi(val);
        }
    }
    info.setStartTime();
    info.setDepth(depth);
    if (movetime > -1) {
        time = movetime;
        movestogo = 1;
    }
    if (time > -1 && movestogo > 0) {
        time /= movestogo;
    }
    info.calculateStopTime(time, inc);
    search::go(pos, info);
}